

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# int_helper.c
# Opt level: O3

void helper_vmsumuhs_ppc64
               (CPUPPCState_conflict2 *env,ppc_avr_t *r,ppc_avr_t *a,ppc_avr_t *b,ppc_avr_t *c)

{
  ulong uVar1;
  bool bVar2;
  long lVar3;
  ulong uVar4;
  bool bVar5;
  undefined1 auVar6 [16];
  ushort uVar11;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  uint auStack_28 [2];
  uint32_t prod [8];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  
  lVar3 = 0;
  do {
    uVar4 = *(ulong *)((long)a + lVar3 * 2);
    auVar6._8_8_ = 0;
    auVar6._0_8_ = uVar4;
    uVar1 = *(ulong *)((long)b + lVar3 * 2);
    auVar7._8_8_ = 0;
    auVar7._0_8_ = uVar1;
    auVar6 = pmulhuw(auVar7,auVar6);
    auVar8._0_2_ = (short)uVar1 * (short)uVar4;
    uVar11 = (short)(uVar1 >> 0x30) * (short)(uVar4 >> 0x30);
    auVar10._0_12_ = ZEXT212(uVar11) << 0x30;
    auVar10._12_2_ = uVar11;
    auVar10._14_2_ = auVar6._6_2_;
    auVar9._12_4_ = auVar10._12_4_;
    auVar9._0_10_ = (unkuint10)uVar11 << 0x30;
    auVar9._10_2_ = auVar6._4_2_;
    auVar8._8_8_ = (undefined8)
                   (CONCAT64(auVar9._10_6_,
                             CONCAT22((short)(uVar1 >> 0x20) * (short)(uVar4 >> 0x20),uVar11)) >>
                   0x10);
    auVar8._6_2_ = auVar6._2_2_;
    auVar8._4_2_ = (short)(uVar1 >> 0x10) * (short)(uVar4 >> 0x10);
    auVar8._2_2_ = auVar6._0_2_;
    *(undefined1 (*) [16])(auStack_28 + lVar3) = auVar8;
    lVar3 = lVar3 + 4;
  } while (lVar3 != 8);
  bVar2 = false;
  lVar3 = 3;
  do {
    uVar4 = (ulong)prod[lVar3 * 2 + -1] + (ulong)auStack_28[lVar3 * 2] + (ulong)c->u32[lVar3];
    if (uVar4 >> 0x20 != 0) {
      bVar2 = true;
    }
    if (0xfffffffe < uVar4) {
      uVar4 = 0xffffffff;
    }
    r->u32[lVar3] = (uint32_t)uVar4;
    bVar5 = lVar3 != 0;
    lVar3 = lVar3 + -1;
  } while (bVar5);
  if (bVar2) {
    (env->vscr_sat).u32[0] = 1;
  }
  return;
}

Assistant:

void helper_vmsumuhs(CPUPPCState *env, ppc_avr_t *r, ppc_avr_t *a,
                     ppc_avr_t *b, ppc_avr_t *c)
{
    uint32_t prod[8];
    int i;
    int sat = 0;

    for (i = 0; i < ARRAY_SIZE(r->u16); i++) {
        prod[i] = a->u16[i] * b->u16[i];
    }

    VECTOR_FOR_INORDER_I(i, s32) {
        uint64_t t = (uint64_t)c->u32[i] + prod[2 * i] + prod[2 * i + 1];

        r->u32[i] = cvtuduw(t, &sat);
    }

    if (sat) {
        set_vscr_sat(env);
    }
}